

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_test(stbi__context *s)

{
  stbi__jpeg *j_00;
  stbi__jpeg *j;
  int r;
  stbi__context *s_local;
  
  j_00 = (stbi__jpeg *)stbi__malloc(0x4888);
  if (j_00 == (stbi__jpeg *)0x0) {
    s_local._4_4_ = stbi__err("Out of memory");
  }
  else {
    memset(j_00,0,0x4888);
    j_00->s = s;
    stbi__setup_jpeg(j_00);
    s_local._4_4_ = stbi__decode_jpeg_header(j_00,1);
    stbi__rewind(s);
    free(j_00);
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg* j = (stbi__jpeg*)stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__err("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   j->s = s;
   stbi__setup_jpeg(j);
   r = stbi__decode_jpeg_header(j, STBI__SCAN_type);
   stbi__rewind(s);
   STBI_FREE(j);
   return r;
}